

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::RecordSchema::RecordSchema(RecordSchema *this,string *name)

{
  Name *name_00;
  NodeRecord *in_RDI;
  Node *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffa8;
  Name *in_stack_ffffffffffffffb0;
  
  operator_new(0xd0);
  NodeRecord::NodeRecord(in_RDI);
  Schema::Schema((Schema *)in_RDI,in_stack_ffffffffffffff88);
  (in_RDI->super_NodeImplRecord).super_Node._vptr_Node = (_func_int **)&PTR__RecordSchema_00266410;
  name_00 = (Name *)boost::shared_ptr<avro::Node>::operator->
                              ((shared_ptr<avro::Node> *)
                               &(in_RDI->super_NodeImplRecord).super_Node.type_);
  Name::Name(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Node::setName((Node *)in_RDI,name_00);
  Name::~Name((Name *)in_RDI);
  return;
}

Assistant:

RecordSchema::RecordSchema(const std::string &name) :
    Schema(new NodeRecord)
{
    node_->setName(name);
}